

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

BOOL __thiscall
Js::SmallSpanSequence::Item
          (SmallSpanSequence *this,int index,SmallSpanSequenceIter *iter,StatementData *data)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint index_00;
  int local_34 [2];
  int countOfMissed;
  
  BVar4 = 0;
  if ((this->pStatementBuffer != (GrowingUint32HeapArray *)0x0) &&
     (BVar4 = 0, (uint)index < this->pStatementBuffer->count)) {
    index_00 = iter->accumulatedIndex;
    if ((int)index_00 < 1 || index < (int)index_00) {
      iter->accumulatedIndex = 0;
      iter->accumulatedSourceBegin = this->baseValue;
      iter->accumulatedBytecodeBegin = 0;
      iter->indexOfActualOffset = 0;
      index_00 = 0;
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (index < (int)index_00) {
        return 0;
      }
      if (this->pStatementBuffer->count <= index_00) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x15ca,
                                    "((uint32)iter.accumulatedIndex < pStatementBuffer->Count())",
                                    "(uint32)iter.accumulatedIndex < pStatementBuffer->Count()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        index_00 = iter->accumulatedIndex;
      }
      local_34[0] = 0;
      GetRangeAt(this,index_00,iter,local_34,data);
      iVar1 = data->bytecodeBegin;
      iter->accumulatedSourceBegin = data->sourceBegin;
      iter->accumulatedBytecodeBegin = iVar1;
      iVar1 = iter->accumulatedIndex;
      index_00 = iVar1 + 1;
      iter->accumulatedIndex = index_00;
      if (local_34[0] != 0) {
        iter->indexOfActualOffset = iter->indexOfActualOffset + local_34[0];
      }
    } while (iVar1 != index);
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL SmallSpanSequence::Item(int index, SmallSpanSequenceIter &iter, StatementData & data)
    {
        if (!pStatementBuffer || (uint32)index >= pStatementBuffer->Count())
        {
            return FALSE;
        }

        if (iter.accumulatedIndex <= 0 || iter.accumulatedIndex > index)
        {
            Reset(iter);
        }

        while (iter.accumulatedIndex <= index)
        {
            Assert((uint32)iter.accumulatedIndex < pStatementBuffer->Count());

            int countOfMissed = 0;
            if (!GetRangeAt(iter.accumulatedIndex, iter, &countOfMissed, data))
            {
                Assert(FALSE);
                break;
            }

            // We store the next index
            iter.accumulatedSourceBegin = data.sourceBegin;
            iter.accumulatedBytecodeBegin = data.bytecodeBegin;

            iter.accumulatedIndex++;

            if (countOfMissed)
            {
                iter.indexOfActualOffset += countOfMissed;
            }

            if ((iter.accumulatedIndex - 1) == index)
            {
                return TRUE;
            }
        }

        return FALSE;
    }